

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O0

void __thiscall ggml_backend_registry::ggml_backend_registry(ggml_backend_registry *this)

{
  ggml_backend_reg_t in_RDI;
  ggml_backend_registry *unaff_retaddr;
  undefined1 local_20 [16];
  dl_handle_ptr *in_stack_fffffffffffffff0;
  ggml_backend_reg_t reg;
  
  reg = in_RDI;
  std::vector<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>::vector
            ((vector<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_> *)0x114520);
  std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::vector
            ((vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *)0x114533);
  ggml_backend_cpu_reg();
  std::unique_ptr<void,dl_handle_deleter>::unique_ptr<dl_handle_deleter,void>
            ((unique_ptr<void,_dl_handle_deleter> *)in_RDI,local_20);
  register_backend(unaff_retaddr,reg,in_stack_fffffffffffffff0);
  std::unique_ptr<void,_dl_handle_deleter>::~unique_ptr
            ((unique_ptr<void,_dl_handle_deleter> *)in_RDI);
  return;
}

Assistant:

ggml_backend_registry() {
#ifdef GGML_USE_CUDA
        register_backend(ggml_backend_cuda_reg());
#endif
#ifdef GGML_USE_METAL
        register_backend(ggml_backend_metal_reg());
#endif
#ifdef GGML_USE_SYCL
        register_backend(ggml_backend_sycl_reg());
#endif
#ifdef GGML_USE_VULKAN
        register_backend(ggml_backend_vk_reg());
#endif
#ifdef GGML_USE_OPENCL
        register_backend(ggml_backend_opencl_reg());
#endif
#ifdef GGML_USE_CANN
        register_backend(ggml_backend_cann_reg());
#endif
#ifdef GGML_USE_BLAS
        register_backend(ggml_backend_blas_reg());
#endif
#ifdef GGML_USE_RPC
        register_backend(ggml_backend_rpc_reg());
#endif
#ifdef GGML_USE_KOMPUTE
        register_backend(ggml_backend_kompute_reg());
#endif
#ifdef GGML_USE_CPU
        register_backend(ggml_backend_cpu_reg());
#endif
    }